

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

key_components * eddsa_components(ssh_key *key)

{
  key_components *kc;
  mp_int *y;
  mp_int *x;
  mp_int *local_30;
  mp_int *local_28;
  
  kc = key_components_new();
  key_components_add_text(kc,"key_type","EdDSA");
  key_components_add_text(kc,"curve_name",(char *)(key[-3].vt)->new_priv_openssh);
  ecc_edwards_get_affine((EdwardsPoint *)key[-2].vt,&local_28,&local_30);
  key_components_add_mp(kc,"public_affine_x",local_28);
  key_components_add_mp(kc,"public_affine_y",local_30);
  mp_free(local_28);
  mp_free(local_30);
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    key_components_add_mp(kc,"private_exponent",(mp_int *)key[-1].vt);
  }
  return kc;
}

Assistant:

static key_components *eddsa_components(ssh_key *key)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    key_components *kc = key_components_new();

    key_components_add_text(kc, "key_type", "EdDSA");
    key_components_add_text(kc, "curve_name", ek->curve->textname);

    mp_int *x, *y;
    ecc_edwards_get_affine(ek->publicKey, &x, &y);
    key_components_add_mp(kc, "public_affine_x", x);
    key_components_add_mp(kc, "public_affine_y", y);
    mp_free(x);
    mp_free(y);

    if (ek->privateKey)
        key_components_add_mp(kc, "private_exponent", ek->privateKey);

    return kc;
}